

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_not(void)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  undefined4 *puVar4;
  uint *Ra_2;
  int16_t *Ra_1;
  char *Ra;
  uint8_t low;
  uint8_t high;
  
  bVar3 = (byte)code_ptr[registe_ptr->IP + 1] / 0x10;
  bVar2 = (byte)code_ptr[registe_ptr->IP + 1] % 0x10;
  if (bVar2 == 0) {
    puVar1 = register_list[bVar3];
    *(byte *)puVar1 = (byte)*puVar1 ^ 0xff;
    set_flag((byte)*puVar1);
  }
  else if (bVar2 == 1) {
    puVar1 = register_list[bVar3];
    *(ushort *)puVar1 = (ushort)*puVar1 ^ 0xffff;
    set_flag((ushort)*puVar1);
  }
  else {
    if (bVar2 != 2) {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xf6;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    puVar1 = register_list[bVar3];
    *puVar1 = *puVar1 ^ 0xffffffff;
    set_flag(*puVar1);
  }
  return 1;
}

Assistant:

int do_not(){
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 1] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;
	if (low == 0) {
		char*Ra = (char *)register_list[high];
		*Ra = ~*Ra;
		set_flag(*Ra);
	}
	else if (low == 1)
	{
		int16_t*Ra = (int16_t *)register_list[high];
		*Ra = ~*Ra;
		set_flag(*Ra);
	}
	else if (low == 2)
	{
		unsigned*Ra = (unsigned *)register_list[high];
		*Ra = ~*Ra;
		set_flag(*Ra);
	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}